

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall anon_unknown.dwarf_515ef::SetExpr::_parse(SetExpr *this,Context *con)

{
  Index *pIVar1;
  int *piVar2;
  _Bit_type *p_Var3;
  Index IVar4;
  int iVar5;
  char32_t cVar6;
  
  if (((con->position).it.buffer != (con->finish).buffer) ||
     ((con->position).it.idx != (con->finish).idx)) {
    cVar6 = pegmatite::Context::symbol(con);
    p_Var3 = (this->mSetExpr).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    if (((ulong)(uint)cVar6 <
         (ulong)(this->mSetExpr).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
         ((long)(this->mSetExpr).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var3) * 8
        ) && ((p_Var3[(uint)cVar6 >> 6] >> ((ulong)(uint)cVar6 & 0x3f) & 1) != 0)) {
      pIVar1 = &(con->position).it.idx;
      *pIVar1 = *pIVar1 + 1;
      piVar2 = &(con->position).col;
      *piVar2 = *piVar2 + 1;
      return true;
    }
  }
  if ((con->error_pos).it.idx < (con->position).it.idx) {
    iVar5 = (con->position).col;
    (con->error_pos).line = (con->position).line;
    (con->error_pos).col = iVar5;
    IVar4 = (con->position).it.idx;
    (con->error_pos).it.buffer = (con->position).it.buffer;
    (con->error_pos).it.idx = IVar4;
  }
  return false;
}

Assistant:

bool _parse(Context &con) const
	{
		if (!con.end())
		{
			size_t ch = con.symbol();
			if (ch < mSetExpr.size() && mSetExpr[ch])
			{
				con.next_col();
				return true;
			}
		}
		con.set_error_pos();
		return false;
	}